

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void debugcode(char *fmt,...)

{
  char in_AL;
  identlink *piVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar2;
  int iVar3;
  undefined8 in_RSI;
  char *fmt_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (nodebug == 0) {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &args[0].overflow_arg_area;
    local_108.gp_offset = 8;
    local_108.fp_offset = 0x30;
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    conoutfv(4,fmt,&local_108);
    if (dbgalias != 0) {
      uVar2 = 0;
      for (piVar1 = aliasstack; piVar1 != &noalias; piVar1 = piVar1->next) {
        uVar2 = uVar2 + 1;
      }
      if (aliasstack != &noalias) {
        iVar3 = 1;
        piVar1 = aliasstack;
        do {
          fmt_00 = "  %d) %s";
          if (iVar3 < dbgalias) {
LAB_00126e2e:
            conoutf(4,fmt_00,(ulong)uVar2,piVar1->id->name);
          }
          else if (piVar1->next == &noalias) {
            fmt_00 = "  ..%d) %s";
            if (iVar3 == dbgalias) {
              fmt_00 = "  %d) %s";
            }
            goto LAB_00126e2e;
          }
          piVar1 = piVar1->next;
          uVar2 = uVar2 - 1;
          iVar3 = iVar3 + 1;
        } while (piVar1 != &noalias);
      }
    }
  }
  return;
}

Assistant:

static void debugcode(const char *fmt, ...)
{
    if(nodebug) return;

    va_list args;
    va_start(args, fmt);
    conoutfv(CON_ERROR, fmt, args);
    va_end(args);

    if(!dbgalias) return;
    int total = 0, depth = 0;
    for(identlink *l = aliasstack; l != &noalias; l = l->next) total++;
    for(identlink *l = aliasstack; l != &noalias; l = l->next)
    {
        ident *id = l->id;
        ++depth;
        if(depth < dbgalias) conoutf(CON_ERROR, "  %d) %s", total-depth+1, id->name);
        else if(l->next == &noalias) conoutf(CON_ERROR, depth == dbgalias ? "  %d) %s" : "  ..%d) %s", total-depth+1, id->name);
    }
}